

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O1

void __thiscall
CRenderTools::RenderTee
          (CRenderTools *this,CAnimState *pAnim,CTeeRenderInfo *pInfo,int Emote,vec2 Dir,vec2 Pos)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  long in_FS_OFFSET;
  bool bVar16;
  bool bVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_88;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_84;
  undefined8 local_58;
  float local_50;
  float local_4c;
  undefined8 local_48;
  float local_40;
  float local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar6 = (pInfo->m_BotTexture).m_Id;
  bVar17 = iVar6 < 0;
  lVar7 = 0x24;
  if (bVar17) {
    lVar7 = 0x84;
  }
  lVar8 = 0x28;
  if (bVar17) {
    lVar8 = 0x88;
  }
  lVar9 = 0x2c;
  if (bVar17) {
    lVar9 = 0x8c;
  }
  lVar10 = 0x30;
  if (bVar17) {
    lVar10 = 0x90;
  }
  iVar14 = 0;
  do {
    bVar17 = iVar14 == 0;
    iVar11 = 0;
    do {
      fVar1 = pInfo->m_Size;
      fVar18 = fVar1 * 0.015625;
      local_88 = Pos.field_0;
      aStack_84 = Pos.field_1;
      if (iVar11 == 1) {
        uVar2 = (pAnim->m_Body).m_X;
        uVar4 = (pAnim->m_Body).m_Y;
        fVar21 = (float)uVar2 * fVar18 + local_88.x;
        fVar22 = (float)uVar4 * fVar18 + aStack_84.y;
        if (-1 < iVar6 && !bVar17) {
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])
                    (this->m_pGraphics,(ulong)(uint)(pInfo->m_BotTexture).m_Id);
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                    (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
          if (0x5b < g_pData->m_NumSprites) {
            SelectSprite(this,g_pData->m_aSprites + 0x5b,0,0,0);
          }
          fVar19 = fVar18 * 0.6666667 + fVar21;
          fVar20 = fVar18 * -15.333333 + fVar22;
          local_48 = CONCAT44(fVar20,fVar19);
          local_40 = fVar1;
          local_3c = fVar1;
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])
                    (this->m_pGraphics,&local_48,1);
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
          if (-1 < iVar6 && !bVar17) {
            (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])
                      (this->m_pGraphics,(ulong)(uint)(pInfo->m_BotTexture).m_Id);
            (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
            (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                      (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
            if (0x5a < g_pData->m_NumSprites) {
              SelectSprite(this,g_pData->m_aSprites + 0x5a,0,0,0);
            }
            local_48 = CONCAT44(fVar20,fVar19);
            local_40 = fVar1;
            local_3c = fVar1;
            (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])
                      (this->m_pGraphics,&local_48,1);
            (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                      ((pInfo->m_BotColor).field_0.x,(pInfo->m_BotColor).field_1.y,
                       (pInfo->m_BotColor).field_2.z,(pInfo->m_BotColor).field_3.w);
            if (0x59 < g_pData->m_NumSprites) {
              SelectSprite(this,g_pData->m_aSprites + 0x59,0,0,0);
            }
            local_48 = CONCAT44(fVar20,fVar19);
            local_40 = fVar1;
            local_3c = fVar1;
            (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])
                      (this->m_pGraphics,&local_48,1);
            (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
          }
        }
        if (-1 < pInfo->m_aTextures[2].m_Id) {
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])();
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
          fVar19 = (pAnim->m_Body).m_Angle * 3.1415927;
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x19])(fVar19 + fVar19);
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                    (pInfo->m_aColors[2].field_0.x,pInfo->m_aColors[2].field_1.y,
                     pInfo->m_aColors[2].field_2.z,pInfo->m_aColors[2].field_3.w);
          if ((int)(bVar17 | 0x4a) < g_pData->m_NumSprites) {
            SelectSprite(this,(CDataSprite *)
                              ((long)&g_pData->m_aSprites->m_pName + (ulong)((bVar17 | 0x4a) << 5)),
                         0,0,0);
          }
          local_48 = CONCAT44(fVar22,fVar21);
          local_40 = fVar1;
          local_3c = fVar1;
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])
                    (this->m_pGraphics,&local_48,1);
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
        }
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])
                  (this->m_pGraphics,(ulong)(uint)pInfo->m_aTextures[0].m_Id);
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
        fVar19 = (pAnim->m_Body).m_Angle * 3.1415927;
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x19])(fVar19 + fVar19);
        if (iVar14 == 0) {
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                    (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
          lVar13 = 0x8a0;
          if (0x45 < g_pData->m_NumSprites) goto LAB_0018a094;
        }
        else {
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                    (pInfo->m_aColors[0].field_0.x,pInfo->m_aColors[0].field_1.y,
                     pInfo->m_aColors[0].field_2.z,pInfo->m_aColors[0].field_3.w);
          lVar13 = 0x8c0;
          if (0x46 < g_pData->m_NumSprites) {
LAB_0018a094:
            SelectSprite(this,(CDataSprite *)((long)&g_pData->m_aSprites->m_pName + lVar13),0,0,0);
          }
        }
        local_48 = CONCAT44(fVar22,fVar21);
        local_40 = fVar1;
        local_3c = fVar1;
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])
                  (this->m_pGraphics,&local_48,1);
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
        if (-1 < pInfo->m_aTextures[1].m_Id && iVar14 != 0) {
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])();
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
          fVar19 = (pAnim->m_Body).m_Angle * 3.1415927;
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x19])(fVar19 + fVar19);
          fVar19 = pInfo->m_aColors[1].field_3.w;
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                    (pInfo->m_aColors[1].field_0.x * fVar19,pInfo->m_aColors[1].field_1.y * fVar19,
                     pInfo->m_aColors[1].field_2.z * fVar19);
          if (0x49 < g_pData->m_NumSprites) {
            SelectSprite(this,g_pData->m_aSprites + 0x49,0,0,0);
          }
          local_48 = CONCAT44(fVar22,fVar21);
          local_40 = fVar1;
          local_3c = fVar1;
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])
                    (this->m_pGraphics,&local_48,1);
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
        }
        if (iVar14 != 0) {
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])
                    (this->m_pGraphics,(ulong)(uint)pInfo->m_aTextures[0].m_Id);
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
          fVar19 = (pAnim->m_Body).m_Angle * 3.1415927;
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x19])(fVar19 + fVar19);
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                    (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
          iVar15 = 1;
          do {
            iVar12 = (iVar15 != 1) + 0x47;
            if (iVar12 < g_pData->m_NumSprites) {
              SelectSprite(this,(CDataSprite *)
                                ((long)&g_pData->m_aSprites->m_pName + (ulong)(uint)(iVar12 * 0x20))
                           ,0,0,0);
            }
            local_48 = CONCAT44(fVar22,fVar21);
            local_40 = fVar1;
            local_3c = fVar1;
            (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])
                      (this->m_pGraphics,&local_48,1);
            iVar15 = iVar15 + -1;
          } while (iVar15 == 0);
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
        }
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])
                  (this->m_pGraphics,(ulong)(uint)pInfo->m_aTextures[5].m_Id);
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
        fVar19 = (pAnim->m_Body).m_Angle * 3.1415927;
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x19])(fVar19 + fVar19);
        if (-1 < iVar6) {
          Emote = 3;
        }
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                  (*(undefined4 *)((long)&pInfo->m_aTextures[0].m_Id + lVar7),
                   *(undefined4 *)((long)&pInfo->m_aTextures[0].m_Id + lVar8),
                   *(undefined4 *)((long)&pInfo->m_aTextures[0].m_Id + lVar9),
                   *(undefined4 *)((long)&pInfo->m_aTextures[0].m_Id + lVar10));
        if (iVar14 == 1) {
          iVar15 = g_pData->m_NumSprites;
          switch(Emote) {
          case 1:
            lVar13 = 0xa40;
            if (0x52 < iVar15) {
LAB_0018a3ec:
              SelectSprite(this,(CDataSprite *)((long)&g_pData->m_aSprites->m_pName + lVar13),0,0,0)
              ;
            }
            break;
          case 2:
            lVar13 = 0xa60;
            if (0x53 < iVar15) goto LAB_0018a3ec;
            break;
          case 3:
            lVar13 = 0xa80;
            if (0x54 < iVar15) goto LAB_0018a3ec;
            break;
          case 4:
            lVar13 = 0xa20;
            if (0x51 < iVar15) goto LAB_0018a3ec;
            break;
          default:
            lVar13 = 0xa00;
            if (0x50 < iVar15) goto LAB_0018a3ec;
          }
          local_50 = fVar1 * 0.6;
          local_4c = fVar1 * 0.15;
          if (Emote != 5) {
            local_4c = local_50;
          }
          local_4c = local_4c * 0.5;
          local_58 = CONCAT44(fVar1 * (Dir.field_1.y * 0.1 + -0.05) + fVar22,
                              fVar1 * Dir.field_0.x * 0.125 + fVar21);
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])
                    (this->m_pGraphics,&local_58,1);
        }
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
        if ((iVar14 != 0) && (-1 < (pInfo->m_HatTexture).m_Id)) {
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])();
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
          fVar19 = (pAnim->m_Body).m_Angle * 3.1415927;
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x19])(fVar19 + fVar19);
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                    (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
          switch(pInfo->m_HatSpriteIndex) {
          case 0:
            lVar13 = 0xaa0;
            if (0x55 < g_pData->m_NumSprites) {
LAB_0018a567:
              SelectSprite(this,(CDataSprite *)((long)&g_pData->m_aSprites->m_pName + lVar13),
                           (uint)(Dir.field_0.x < 0.0) * 2,0,0);
            }
            break;
          case 1:
            lVar13 = 0xac0;
            if (0x56 < g_pData->m_NumSprites) goto LAB_0018a567;
            break;
          case 2:
            lVar13 = 0xae0;
            if (0x57 < g_pData->m_NumSprites) goto LAB_0018a567;
            break;
          case 3:
            lVar13 = 0xb00;
            if (0x58 < g_pData->m_NumSprites) goto LAB_0018a567;
          }
          local_48 = CONCAT44(fVar22,fVar21);
          local_40 = fVar1;
          local_3c = fVar1;
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])
                    (this->m_pGraphics,&local_48,1);
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
        }
      }
      (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])
                (this->m_pGraphics,(ulong)(uint)pInfo->m_aTextures[4].m_Id);
      (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
      fVar21 = (&pAnim->m_BackFoot)[iVar11 != 0].m_Angle * 3.1415927;
      (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x19])(fVar21 + fVar21);
      if (iVar14 == 0) {
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                  (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
        lVar13 = 0x9e0;
        if (0x4f < g_pData->m_NumSprites) goto LAB_0018a69e;
      }
      else {
        fVar21 = 1.0;
        if (pInfo->m_GotAirJump == 0) {
          fVar21 = *(float *)(&DAT_001dbad8 +
                             (ulong)(this->m_pConfig->m_ClAirjumpindicator == 0) * 4);
        }
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                  (pInfo->m_aColors[4].field_0.x * fVar21,pInfo->m_aColors[4].field_1.y * fVar21,
                   fVar21 * pInfo->m_aColors[4].field_2.z,pInfo->m_aColors[4].field_3.w);
        lVar13 = 0x9c0;
        if (0x4e < g_pData->m_NumSprites) {
LAB_0018a69e:
          SelectSprite(this,(CDataSprite *)((long)&g_pData->m_aSprites->m_pName + lVar13),0,0,0);
        }
      }
      uVar3 = (&pAnim->m_BackFoot)[iVar11 != 0].m_X;
      uVar5 = (&pAnim->m_BackFoot)[iVar11 != 0].m_Y;
      local_48 = CONCAT44(fVar18 * (float)uVar5 + aStack_84.y,fVar18 * (float)uVar3 + local_88.x);
      local_40 = fVar1 / 2.1;
      local_3c = fVar1 / 2.1;
      (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])(this->m_pGraphics,&local_48,1)
      ;
      (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
      bVar16 = iVar11 == 0;
      iVar11 = iVar11 + 1;
    } while (bVar16);
    bVar17 = iVar14 != 0;
    iVar14 = iVar14 + 1;
    if (bVar17) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
  } while( true );
}

Assistant:

void CRenderTools::RenderTee(CAnimState *pAnim, const CTeeRenderInfo *pInfo, int Emote, vec2 Dir, vec2 Pos)
{
	vec2 Direction = Dir;
	vec2 Position = Pos;
	bool IsBot = pInfo->m_BotTexture.IsValid();

	// first pass we draw the outline
	// second pass we draw the filling
	for(int p = 0; p < 2; p++)
	{
		bool OutLine = p==0;

		for(int f = 0; f < 2; f++)
		{
			float AnimScale = pInfo->m_Size * 1.0f/64.0f;
			float BaseSize = pInfo->m_Size;
			if(f == 1)
			{
				vec2 BodyPos = Position + vec2(pAnim->GetBody()->m_X, pAnim->GetBody()->m_Y)*AnimScale;
				IGraphics::CQuadItem BodyItem(BodyPos.x, BodyPos.y, BaseSize, BaseSize);
				IGraphics::CQuadItem BotItem(BodyPos.x+(2.f/3.f)*AnimScale, BodyPos.y+(-16+2.f/3.f)*AnimScale, BaseSize, BaseSize); // x+0.66, y+0.66 to correct some rendering bug
				IGraphics::CQuadItem Item;

				// draw bot visuals (background)
				if(IsBot && !OutLine)
				{
					Graphics()->TextureSet(pInfo->m_BotTexture);
					Graphics()->QuadsBegin();
					Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
					SelectSprite(SPRITE_TEE_BOT_BACKGROUND, 0, 0, 0);
					Item = BotItem;
					Graphics()->QuadsDraw(&Item, 1);
					Graphics()->QuadsEnd();
				}

				// draw bot visuals (foreground)
				if(IsBot && !OutLine)
				{
					Graphics()->TextureSet(pInfo->m_BotTexture);
					Graphics()->QuadsBegin();
					Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
					SelectSprite(SPRITE_TEE_BOT_FOREGROUND, 0, 0, 0);
					Item = BotItem;
					Graphics()->QuadsDraw(&Item, 1);
					Graphics()->SetColor(pInfo->m_BotColor.r, pInfo->m_BotColor.g, pInfo->m_BotColor.b, pInfo->m_BotColor.a);
					SelectSprite(SPRITE_TEE_BOT_GLOW, 0, 0, 0);
					Item = BotItem;
					Graphics()->QuadsDraw(&Item, 1);
					Graphics()->QuadsEnd();
				}

				// draw decoration
				if(pInfo->m_aTextures[SKINPART_DECORATION].IsValid())
				{
					Graphics()->TextureSet(pInfo->m_aTextures[2]);
					Graphics()->QuadsBegin();
					Graphics()->QuadsSetRotation(pAnim->GetBody()->m_Angle*pi*2);
					Graphics()->SetColor(pInfo->m_aColors[SKINPART_DECORATION].r, pInfo->m_aColors[SKINPART_DECORATION].g, pInfo->m_aColors[SKINPART_DECORATION].b, pInfo->m_aColors[SKINPART_DECORATION].a);
					SelectSprite(OutLine?SPRITE_TEE_DECORATION_OUTLINE:SPRITE_TEE_DECORATION, 0, 0, 0);
					Item = BodyItem;
					Graphics()->QuadsDraw(&Item, 1);
					Graphics()->QuadsEnd();
				}

				// draw body (behind marking)
				Graphics()->TextureSet(pInfo->m_aTextures[SKINPART_BODY]);
				Graphics()->QuadsBegin();
				Graphics()->QuadsSetRotation(pAnim->GetBody()->m_Angle*pi*2);
				if(OutLine)
				{
					Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
					SelectSprite(SPRITE_TEE_BODY_OUTLINE, 0, 0, 0);
				}
				else
				{
					Graphics()->SetColor(pInfo->m_aColors[SKINPART_BODY].r, pInfo->m_aColors[SKINPART_BODY].g, pInfo->m_aColors[SKINPART_BODY].b, pInfo->m_aColors[SKINPART_BODY].a);
					SelectSprite(SPRITE_TEE_BODY, 0, 0, 0);
				}
				Item = BodyItem;
				Graphics()->QuadsDraw(&Item, 1);
				Graphics()->QuadsEnd();

				// draw marking
				if(pInfo->m_aTextures[SKINPART_MARKING].IsValid() && !OutLine)
				{
					Graphics()->TextureSet(pInfo->m_aTextures[SKINPART_MARKING]);
					Graphics()->QuadsBegin();
					Graphics()->QuadsSetRotation(pAnim->GetBody()->m_Angle*pi*2);
					Graphics()->SetColor(pInfo->m_aColors[SKINPART_MARKING].r*pInfo->m_aColors[SKINPART_MARKING].a, pInfo->m_aColors[SKINPART_MARKING].g*pInfo->m_aColors[SKINPART_MARKING].a,
						pInfo->m_aColors[SKINPART_MARKING].b*pInfo->m_aColors[SKINPART_MARKING].a, pInfo->m_aColors[SKINPART_MARKING].a);
					SelectSprite(SPRITE_TEE_MARKING, 0, 0, 0);
					Item = BodyItem;
					Graphics()->QuadsDraw(&Item, 1);
					Graphics()->QuadsEnd();
				}

				// draw body (in front of marking)
				if(!OutLine)
				{
					Graphics()->TextureSet(pInfo->m_aTextures[SKINPART_BODY]);
					Graphics()->QuadsBegin();
					Graphics()->QuadsSetRotation(pAnim->GetBody()->m_Angle*pi*2);
					Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
					for(int t = 0; t < 2; t++)
					{
						SelectSprite(t==0?SPRITE_TEE_BODY_SHADOW:SPRITE_TEE_BODY_UPPER_OUTLINE, 0, 0, 0);
						Item = BodyItem;
						Graphics()->QuadsDraw(&Item, 1);
					}
					Graphics()->QuadsEnd();
				}

				// draw eyes
				Graphics()->TextureSet(pInfo->m_aTextures[SKINPART_EYES]);
				Graphics()->QuadsBegin();
				Graphics()->QuadsSetRotation(pAnim->GetBody()->m_Angle*pi*2);
				if(IsBot)
				{
					Graphics()->SetColor(pInfo->m_BotColor.r, pInfo->m_BotColor.g, pInfo->m_BotColor.b, pInfo->m_BotColor.a);
					Emote = EMOTE_SURPRISE;
				}
				else
					Graphics()->SetColor(pInfo->m_aColors[SKINPART_EYES].r, pInfo->m_aColors[SKINPART_EYES].g, pInfo->m_aColors[SKINPART_EYES].b, pInfo->m_aColors[SKINPART_EYES].a);
				if(p == 1)
				{
					switch (Emote)
					{
						case EMOTE_PAIN:
							SelectSprite(SPRITE_TEE_EYES_PAIN, 0, 0, 0);
							break;
						case EMOTE_HAPPY:
							SelectSprite(SPRITE_TEE_EYES_HAPPY, 0, 0, 0);
							break;
						case EMOTE_SURPRISE:
							SelectSprite(SPRITE_TEE_EYES_SURPRISE, 0, 0, 0);
							break;
						case EMOTE_ANGRY:
							SelectSprite(SPRITE_TEE_EYES_ANGRY, 0, 0, 0);
							break;
						default:
							SelectSprite(SPRITE_TEE_EYES_NORMAL, 0, 0, 0);
							break;
					}

					float EyeScale = BaseSize*0.60f;
					float h = Emote == EMOTE_BLINK ? BaseSize*0.15f/2.0f : EyeScale/2.0f;
					vec2 Offset = vec2(Direction.x*0.125f, -0.05f+Direction.y*0.10f)*BaseSize;
					IGraphics::CQuadItem QuadItem(BodyPos.x+Offset.x, BodyPos.y+Offset.y, EyeScale, h);
					Graphics()->QuadsDraw(&QuadItem, 1);
				}
				Graphics()->QuadsEnd();
				
				// draw xmas hat
				if(!OutLine && pInfo->m_HatTexture.IsValid())
				{
					Graphics()->TextureSet(pInfo->m_HatTexture);
					Graphics()->QuadsBegin();
					Graphics()->QuadsSetRotation(pAnim->GetBody()->m_Angle*pi * 2);
					Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
					int Flag = Direction.x < 0.0f ? SPRITE_FLAG_FLIP_X : 0;
					switch(pInfo->m_HatSpriteIndex)
					{
					case 0:
						SelectSprite(SPRITE_TEE_HATS_TOP1, Flag, 0, 0);
						break;
					case 1:
						SelectSprite(SPRITE_TEE_HATS_TOP2, Flag, 0, 0);
						break;
					case 2:
						SelectSprite(SPRITE_TEE_HATS_SIDE1, Flag, 0, 0);
						break;
					case 3:
						SelectSprite(SPRITE_TEE_HATS_SIDE2, Flag, 0, 0);
					}
					Item = BodyItem;
					Graphics()->QuadsDraw(&Item, 1);
					Graphics()->QuadsEnd();
				}
			}

			// draw feet
			Graphics()->TextureSet(pInfo->m_aTextures[SKINPART_FEET]);
			Graphics()->QuadsBegin();
			CAnimKeyframe *pFoot = f ? pAnim->GetFrontFoot() : pAnim->GetBackFoot();

			float w = BaseSize/2.1f;
			float h = w;

			Graphics()->QuadsSetRotation(pFoot->m_Angle*pi*2);

			if(OutLine)
			{
				Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
				SelectSprite(SPRITE_TEE_FOOT_OUTLINE, 0, 0, 0);
			}
			else
			{
				bool Indicate = !pInfo->m_GotAirJump && m_pConfig->m_ClAirjumpindicator;
				float cs = 1.0f; // color scale
				if(Indicate)
					cs = 0.5f;
				Graphics()->SetColor(pInfo->m_aColors[SKINPART_FEET].r*cs, pInfo->m_aColors[SKINPART_FEET].g*cs, pInfo->m_aColors[SKINPART_FEET].b*cs, pInfo->m_aColors[SKINPART_FEET].a);
				SelectSprite(SPRITE_TEE_FOOT, 0, 0, 0);
			}

			IGraphics::CQuadItem QuadItem(Position.x+pFoot->m_X*AnimScale, Position.y+pFoot->m_Y*AnimScale, w, h);
			Graphics()->QuadsDraw(&QuadItem, 1);
			Graphics()->QuadsEnd();
		}
	}
}